

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O2

void sad64x2(uint16_t *src_ptr,int src_stride,uint16_t *ref_ptr,int ref_stride,uint16_t *sec_ptr,
            __m256i *sad_acc)

{
  uint16_t *puVar1;
  int iVar2;
  undefined1 (*pauVar3) [32];
  bool bVar4;
  __m256i r [4];
  __m256i s [4];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  pauVar3 = (undefined1 (*) [32])(ref_ptr + 0x30);
  puVar1 = src_ptr + 0x30;
  iVar2 = 2;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    local_e0 = *(longlong *)(puVar1 + -0x30);
    lStack_d8 = *(longlong *)(puVar1 + -0x2c);
    lStack_d0 = *(longlong *)(puVar1 + -0x28);
    lStack_c8 = *(longlong *)(puVar1 + -0x24);
    local_c0 = *(undefined8 *)(puVar1 + -0x20);
    uStack_b8 = *(undefined8 *)(puVar1 + -0x1c);
    uStack_b0 = *(undefined8 *)(puVar1 + -0x18);
    uStack_a8 = *(undefined8 *)(puVar1 + -0x14);
    local_a0 = *(undefined8 *)(puVar1 + -0x10);
    uStack_98 = *(undefined8 *)(puVar1 + -0xc);
    uStack_90 = *(undefined8 *)(puVar1 + -8);
    uStack_88 = *(undefined8 *)(puVar1 + -4);
    local_80 = *(undefined8 *)puVar1;
    uStack_78 = *(undefined8 *)(puVar1 + 4);
    uStack_70 = *(undefined8 *)(puVar1 + 8);
    uStack_68 = *(undefined8 *)(puVar1 + 0xc);
    local_160 = *(__m256i *)(pauVar3 + -3);
    local_140 = pauVar3[-2];
    local_120 = pauVar3[-1];
    local_100 = *pauVar3;
    if ((undefined1 (*) [32])sec_ptr == (undefined1 (*) [32])0x0) {
      sec_ptr = (uint16_t *)0x0;
    }
    else {
      local_160 = (__m256i)vpavgw_avx2((undefined1  [32])local_160,*(undefined1 (*) [32])sec_ptr);
      local_140 = vpavgw_avx2(local_140,*(undefined1 (*) [32])((long)sec_ptr + 0x20));
      local_120 = vpavgw_avx2(local_120,*(undefined1 (*) [32])((long)sec_ptr + 0x40));
      local_100 = vpavgw_avx2(local_100,*(undefined1 (*) [32])((long)sec_ptr + 0x60));
      sec_ptr = (uint16_t *)((long)sec_ptr + 0x80);
    }
    highbd_sad16x4_core_avx2((__m256i *)&local_e0,&local_160,sad_acc);
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + (long)ref_stride * 2);
    puVar1 = puVar1 + src_stride;
  }
  return;
}

Assistant:

static void sad64x2(const uint16_t *src_ptr, int src_stride,
                    const uint16_t *ref_ptr, int ref_stride,
                    const uint16_t *sec_ptr, __m256i *sad_acc) {
  __m256i s[4], r[4];
  int i;
  for (i = 0; i < 2; i++) {
    s[0] = _mm256_loadu_si256((const __m256i *)src_ptr);
    s[1] = _mm256_loadu_si256((const __m256i *)(src_ptr + 16));
    s[2] = _mm256_loadu_si256((const __m256i *)(src_ptr + 32));
    s[3] = _mm256_loadu_si256((const __m256i *)(src_ptr + 48));

    r[0] = _mm256_loadu_si256((const __m256i *)ref_ptr);
    r[1] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 16));
    r[2] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 32));
    r[3] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 48));
    if (sec_ptr) {
      r[0] =
          _mm256_avg_epu16(r[0], _mm256_loadu_si256((const __m256i *)sec_ptr));
      r[1] = _mm256_avg_epu16(
          r[1], _mm256_loadu_si256((const __m256i *)(sec_ptr + 16)));
      r[2] = _mm256_avg_epu16(
          r[2], _mm256_loadu_si256((const __m256i *)(sec_ptr + 32)));
      r[3] = _mm256_avg_epu16(
          r[3], _mm256_loadu_si256((const __m256i *)(sec_ptr + 48)));
      sec_ptr += 64;
    }
    highbd_sad16x4_core_avx2(s, r, sad_acc);
    src_ptr += src_stride;
    ref_ptr += ref_stride;
  }
}